

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::Desugarer::desugarFields(jsonnet::internal::AST*,std::vector<jsonnet::internal::
ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,unsigned_int)::SubstituteSelfSuper::
visitExpr(jsonnet::internal::AST___(SubstituteSelfSuper *this,AST **expr)

{
  Identifier *pIVar1;
  Var *pVVar2;
  Allocator *this_00;
  Identifier **args_2;
  long *in_RSI;
  long in_RDI;
  uint in_stack_0000004c;
  UStringStream *in_stack_00000050;
  Identifier *in_super_var;
  UStringStream ss_1;
  InSuper *in_super;
  Identifier *super_var;
  UStringStream ss;
  SuperIndex *super_index;
  AST **in_stack_00000148;
  CompilerPass *in_stack_00000150;
  UString *in_stack_fffffffffffffe68;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffe70;
  Identifier **in_stack_fffffffffffffe78;
  vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  *in_stack_fffffffffffffe80;
  vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  *this_01;
  Identifier **in_stack_fffffffffffffe98;
  allocator<char32_t> *in_stack_fffffffffffffea0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *args_1;
  LocationRange *in_stack_fffffffffffffea8;
  Allocator *in_stack_fffffffffffffeb0;
  long local_130;
  long local_108;
  
  if (*in_RSI == 0) {
    local_108 = 0;
  }
  else {
    local_108 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Self::typeinfo,0);
  }
  if (local_108 == 0) {
    if (*in_RSI == 0) {
      local_130 = 0;
    }
    else {
      local_130 = __dynamic_cast(*in_RSI,&AST::typeinfo,&SuperIndex::typeinfo,0);
    }
    if (local_130 == 0) {
      args_1 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)*in_RSI;
      if (args_1 == (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)0x0) {
        args_2 = (Identifier **)0x0;
      }
      else {
        args_2 = (Identifier **)__dynamic_cast(args_1,&AST::typeinfo,&InSuper::typeinfo,0);
      }
      if (args_2 != (Identifier **)0x0) {
        UStringStream::UStringStream((UStringStream *)0x35e861);
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffe70,(char32_t *)in_stack_fffffffffffffe68)
        ;
        **(int **)(in_RDI + 0x20) = **(int **)(in_RDI + 0x20) + 1;
        UStringStream::operator<<(in_stack_00000050,in_stack_0000004c);
        this_01 = *(vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                    **)(in_RDI + 0x10);
        UStringStream::str_abi_cxx11_((UStringStream *)in_stack_fffffffffffffe68);
        pIVar1 = Desugarer::id((Desugarer *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffe70);
        ::std::
        vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
        ::emplace_back<jsonnet::internal::Identifier_const*&,jsonnet::internal::InSuper*&>
                  (this_01,(Identifier **)pIVar1,(InSuper **)in_stack_fffffffffffffe70);
        pVVar2 = Allocator::
                 make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                           (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,args_1,args_2);
        *in_RSI = (long)pVVar2;
        UStringStream::~UStringStream((UStringStream *)0x35e96a);
      }
    }
    else {
      UStringStream::UStringStream((UStringStream *)0x35e662);
      UStringStream::operator<<
                ((UStringStream *)in_stack_fffffffffffffe70,(char32_t *)in_stack_fffffffffffffe68);
      **(int **)(in_RDI + 0x20) = **(int **)(in_RDI + 0x20) + 1;
      UStringStream::operator<<(in_stack_00000050,in_stack_0000004c);
      UStringStream::str_abi_cxx11_((UStringStream *)in_stack_fffffffffffffe68);
      this_00 = (Allocator *)
                Desugarer::id((Desugarer *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffe70);
      if (*(long *)(local_130 + 0x98) == 0) {
        __assert_fail("super_index->index != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                      ,0x170,
                      "virtual void jsonnet::internal::Desugarer::desugarFields(AST *, ObjectFields &, unsigned int)::SubstituteSelfSuper::visitExpr(AST *&)"
                     );
      }
      ::std::
      vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
      ::emplace_back<jsonnet::internal::Identifier_const*&,jsonnet::internal::SuperIndex*&>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (SuperIndex **)in_stack_fffffffffffffe70);
      pVVar2 = Allocator::
               make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                         (this_00,in_stack_fffffffffffffea8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      *in_RSI = (long)pVVar2;
      UStringStream::~UStringStream((UStringStream *)0x35e7da);
    }
  }
  else {
    if (*(long *)(in_RDI + 0x28) == 0) {
      ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x35e4d3);
      ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffffeb0,(char32_t *)in_stack_fffffffffffffea8,
                 in_stack_fffffffffffffea0);
      pIVar1 = Desugarer::id((Desugarer *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      *(Identifier **)(in_RDI + 0x28) = pIVar1;
      ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffffe70);
      ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x35e538);
      ::std::
      vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
      ::emplace_back<jsonnet::internal::Identifier_const*&,decltype(nullptr)>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (void **)in_stack_fffffffffffffe70);
    }
    pVVar2 = Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    *in_RSI = (long)pVVar2;
  }
  CompilerPass::visitExpr(in_stack_00000150,in_stack_00000148);
  return;
}

Assistant:

void visitExpr(AST *&expr)
            {
                if (dynamic_cast<Self *>(expr)) {
                    if (newSelf == nullptr) {
                        newSelf = desugarer->id(U"$outer_self");
                        superVars.emplace_back(newSelf, nullptr);
                    }
                    expr = alloc.make<Var>(expr->location, expr->openFodder, newSelf);
                } else if (auto *super_index = dynamic_cast<SuperIndex *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_super_index" << (counter++);
                    const Identifier *super_var = desugarer->id(ss.str());
                    // Desugaring of expr should already have occurred.
                    assert(super_index->index != nullptr);
                    // Re-use super_index since we're replacing it here.
                    superVars.emplace_back(super_var, super_index);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, super_var);
                } else if (auto *in_super = dynamic_cast<InSuper *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_in_super" << (counter++);
                    const Identifier *in_super_var = desugarer->id(ss.str());
                    // Re-use in_super since we're replacing it here.
                    superVars.emplace_back(in_super_var, in_super);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, in_super_var);
                }
                CompilerPass::visitExpr(expr);
            }